

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ucum.cpp
# Opt level: O0

void __thiscall UCUM_TestAllUnits_Test::~UCUM_TestAllUnits_Test(UCUM_TestAllUnits_Test *this)

{
  UCUM_TestAllUnits_Test *this_local;
  
  ~UCUM_TestAllUnits_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(UCUM, TestAllUnits)
{
    units::setUnitsDomain(units::domains::ucum);
    std::ifstream i(TEST_FILE_FOLDER "/ucumDefs.json");
    nlohmann::json defs;
    i >> defs;
    i.close();
    int ciFail = 0;
    int csFail = 0;
    int ceqFail = 0;
    for (const auto& junit : defs["units"]) {
        auto csCode = junit["csCode_"].get<std::string>();
        auto ciCode = junit["ciCode_"].get<std::string>();

        auto csact = units::unit_from_string(csCode);

        if (is_error(csact)) {
            std::cout << csCode << " does not result in a valid cs unit for "
                      << junit["name_"] << '\n';
            units::unit_from_string(csCode, 0);
            ++csFail;
        }
        auto ciact = units::unit_from_string(ciCode, units::case_insensitive);
        if (is_error(ciact)) {
            std::cout << ciCode << " does not result in a valid ci unit for "
                      << junit["name_"] << '\n';

            ++ciFail;
        }
        if (!(ciCode.empty() || csCode.empty())) {
            if (ciact != csact) {
                if (csCode.find(".h") != std::string::npos) {
                    continue;
                }
                if (csact / units::precise::count == ciact) {
                    continue;
                }
                std::cout << ciCode << " and " << csCode
                          << " do not produce the same unit " << junit["name_"]
                          << '\n';
                ++ceqFail;
            }
        }
    }
    EXPECT_EQ(csFail, 0);
    EXPECT_EQ(ciFail, 0);
    if (csFail > 0 || ciFail > 0) {
        std::cout << csFail << " units failed Case sensitive conversion\n";
        std::cout << ciFail << " units failed Case insensitive conversion\n";
    }
    if (ceqFail > 0) {
        std::cout << ceqFail
                  << " units failed to produce matching conversions\n";
    }
}